

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O1

string * Path::basedir(string *__return_storage_ptr__,string *path)

{
  pointer pcVar1;
  bool bVar2;
  long lVar3;
  char *pcVar4;
  char *pcVar5;
  
  if (path->_M_string_length == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar4 = "";
    pcVar5 = "";
LAB_0014e147:
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar5,pcVar4);
  }
  else {
    bVar2 = is_root_path(path);
    if (bVar2) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar1 = (path->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,pcVar1,pcVar1 + path->_M_string_length);
      return __return_storage_ptr__;
    }
    lVar3 = std::__cxx11::string::rfind((char)path,0x2f);
    if (lVar3 == 0) {
      is_abspath(path);
    }
    else if (lVar3 == -1) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar5 = ".";
      pcVar4 = "";
      goto LAB_0014e147;
    }
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)path);
    bVar2 = is_root_path(__return_storage_ptr__);
    if (!bVar2) {
      std::__cxx11::string::_M_erase
                ((ulong)__return_storage_ptr__,__return_storage_ptr__->_M_string_length - 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string basedir(const string &path)
{
	if (path.empty())
		return "";

	if (is_root_path(path))
		return path;

	auto index = find_last_slash(path);
	if (index == string::npos)
		return ".";

	// Preserve the first slash.
	if (index == 0 && is_abspath(path))
		index++;

	auto ret = path.substr(0, index + 1);
	if (!is_root_path(ret))
		ret.pop_back();
	return ret;
}